

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O0

Gia_Man_t *
Gia_PolynCoreDetectTest_int(Gia_Man_t *pGia,Vec_Int_t *vAddCos,int fAddCones,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *vOrder_00;
  Vec_Int_t *p;
  abctime aVar6;
  Vec_Int_t *vNodes;
  Vec_Int_t *vOrder;
  Vec_Int_t *vRoots;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vAdds;
  Gia_Man_t *pNew;
  abctime clk;
  int fVerbose_local;
  int fAddCones_local;
  Vec_Int_t *vAddCos_local;
  Gia_Man_t *pGia_local;
  
  clk._0_4_ = fVerbose;
  clk._4_4_ = fAddCones;
  _fVerbose_local = vAddCos;
  vAddCos_local = (Vec_Int_t *)pGia;
  pNew = (Gia_Man_t *)Abc_Clock();
  vLeaves = Ree_ManComputeCuts((Gia_Man_t *)vAddCos_local,(Vec_Int_t **)0x0,1);
  vOrder_00 = Gia_PolynCoreOrder((Gia_Man_t *)vAddCos_local,vLeaves,_fVerbose_local,&vRoots,&vOrder)
  ;
  p = Gia_PolynCoreCollect((Gia_Man_t *)vAddCos_local,vLeaves,vOrder_00);
  iVar1 = Vec_IntSize(vLeaves);
  uVar2 = Vec_IntSize(vRoots);
  uVar3 = Vec_IntSize(vOrder);
  uVar4 = Vec_IntSize(p);
  uVar5 = Vec_IntSize(vOrder_00);
  printf("Detected %d FAs/HAs. Roots = %d. Leaves = %d. Nodes = %d. Adds = %d. ",
         (ulong)(uint)(iVar1 / 6),(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
  aVar6 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar6 - (long)pNew);
  Gia_PolynCorePrintCones((Gia_Man_t *)vAddCos_local,vRoots,(int)clk);
  vAdds = (Vec_Int_t *)
          Gia_PolynCoreDupTree((Gia_Man_t *)vAddCos_local,_fVerbose_local,vRoots,p,clk._4_4_);
  Vec_IntFree(vLeaves);
  Vec_IntFree(vRoots);
  Vec_IntFree(vOrder);
  Vec_IntFree(vOrder_00);
  Vec_IntFree(p);
  return (Gia_Man_t *)vAdds;
}

Assistant:

Gia_Man_t * Gia_PolynCoreDetectTest_int( Gia_Man_t * pGia, Vec_Int_t * vAddCos, int fAddCones, int fVerbose )
{
    extern Vec_Int_t * Ree_ManComputeCuts( Gia_Man_t * p, Vec_Int_t ** pvXors, int fVerbose );
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;
    Vec_Int_t * vAdds = Ree_ManComputeCuts( pGia, NULL, 1 );
    Vec_Int_t * vLeaves, * vRoots, * vOrder = Gia_PolynCoreOrder( pGia, vAdds, vAddCos, &vLeaves, &vRoots );
    Vec_Int_t * vNodes = Gia_PolynCoreCollect( pGia, vAdds, vOrder );

    //Gia_ManShow( pGia, vNodes, 0 );
    
    printf( "Detected %d FAs/HAs. Roots = %d. Leaves = %d. Nodes = %d. Adds = %d. ", 
        Vec_IntSize(vAdds)/6, Vec_IntSize(vLeaves), Vec_IntSize(vRoots), Vec_IntSize(vNodes), Vec_IntSize(vOrder) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    Gia_PolynCorePrintCones( pGia, vLeaves, fVerbose );

    pNew = Gia_PolynCoreDupTree( pGia, vAddCos, vLeaves, vNodes, fAddCones );

    Vec_IntFree( vAdds );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vRoots );
    Vec_IntFree( vOrder );
    Vec_IntFree( vNodes );
    return pNew;
}